

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

idx_t duckdb::BinaryExecutor::SelectGenericLoopSelSwitch<float,float,duckdb::GreaterThan,false>
                (float *ldata,float *rdata,SelectionVector *lsel,SelectionVector *rsel,
                SelectionVector *result_sel,idx_t count,ValidityMask *lvalidity,
                ValidityMask *rvalidity,SelectionVector *true_sel,SelectionVector *false_sel)

{
  sel_t *psVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  unsigned_long *puVar4;
  bool bVar5;
  ulong uVar6;
  idx_t iVar7;
  ulong uVar8;
  SelectionVector *pSVar9;
  idx_t iVar10;
  idx_t iVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  idx_t local_50;
  
  if (false_sel == (SelectionVector *)0x0 || true_sel == (SelectionVector *)0x0) {
    if (true_sel == (SelectionVector *)0x0) {
      if (count == 0) {
        lVar12 = 0;
      }
      else {
        psVar1 = result_sel->sel_vector;
        psVar2 = lsel->sel_vector;
        psVar3 = rsel->sel_vector;
        lVar12 = 0;
        uVar14 = 0;
        do {
          uVar13 = uVar14;
          if (psVar1 != (sel_t *)0x0) {
            uVar13 = (ulong)psVar1[uVar14];
          }
          uVar6 = uVar14;
          if (psVar2 != (sel_t *)0x0) {
            uVar6 = (ulong)psVar2[uVar14];
          }
          uVar8 = uVar14;
          if (psVar3 != (sel_t *)0x0) {
            uVar8 = (ulong)psVar3[uVar14];
          }
          puVar4 = (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if ((((puVar4 != (unsigned_long *)0x0) &&
               ((puVar4[uVar6 >> 6] >> (uVar6 & 0x3f) & 1) == 0)) ||
              ((puVar4 = (rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
               puVar4 != (unsigned_long *)0x0 && ((puVar4[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) == 0)))
              ) || (bVar5 = GreaterThan::Operation<float>(ldata + uVar6,rdata + uVar8), !bVar5)) {
            false_sel->sel_vector[lVar12] = (sel_t)uVar13;
            lVar12 = lVar12 + 1;
          }
          uVar14 = uVar14 + 1;
        } while (count != uVar14);
      }
      return count - lVar12;
    }
    if (count != 0) {
      psVar1 = result_sel->sel_vector;
      psVar2 = lsel->sel_vector;
      psVar3 = rsel->sel_vector;
      local_50 = 0;
      uVar14 = 0;
      do {
        uVar13 = uVar14;
        if (psVar1 != (sel_t *)0x0) {
          uVar13 = (ulong)psVar1[uVar14];
        }
        uVar6 = uVar14;
        if (psVar2 != (sel_t *)0x0) {
          uVar6 = (ulong)psVar2[uVar14];
        }
        uVar8 = uVar14;
        if (psVar3 != (sel_t *)0x0) {
          uVar8 = (ulong)psVar3[uVar14];
        }
        puVar4 = (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if ((((puVar4 == (unsigned_long *)0x0) || ((puVar4[uVar6 >> 6] >> (uVar6 & 0x3f) & 1) != 0))
            && ((puVar4 = (rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
                puVar4 == (unsigned_long *)0x0 || ((puVar4[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) != 0))
               )) && (bVar5 = GreaterThan::Operation<float>(ldata + uVar6,rdata + uVar8), bVar5)) {
          true_sel->sel_vector[local_50] = (sel_t)uVar13;
          local_50 = local_50 + 1;
        }
        uVar14 = uVar14 + 1;
      } while (count != uVar14);
      return local_50;
    }
  }
  else if (count != 0) {
    psVar1 = result_sel->sel_vector;
    psVar2 = lsel->sel_vector;
    psVar3 = rsel->sel_vector;
    local_50 = 0;
    uVar14 = 0;
    iVar10 = 0;
    do {
      uVar13 = uVar14;
      if (psVar1 != (sel_t *)0x0) {
        uVar13 = (ulong)psVar1[uVar14];
      }
      uVar6 = uVar14;
      if (psVar2 != (sel_t *)0x0) {
        uVar6 = (ulong)psVar2[uVar14];
      }
      uVar8 = uVar14;
      if (psVar3 != (sel_t *)0x0) {
        uVar8 = (ulong)psVar3[uVar14];
      }
      puVar4 = (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if ((((puVar4 == (unsigned_long *)0x0) || ((puVar4[uVar6 >> 6] >> (uVar6 & 0x3f) & 1) != 0))
          && ((puVar4 = (rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
              puVar4 == (unsigned_long *)0x0 || ((puVar4[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) != 0))))
         && (bVar5 = GreaterThan::Operation<float>(ldata + uVar6,rdata + uVar8), bVar5)) {
        iVar7 = local_50;
        pSVar9 = true_sel;
        iVar11 = iVar10;
        local_50 = local_50 + 1;
      }
      else {
        iVar11 = iVar10 + 1;
        iVar7 = iVar10;
        pSVar9 = false_sel;
      }
      pSVar9->sel_vector[iVar7] = (sel_t)uVar13;
      uVar14 = uVar14 + 1;
      iVar10 = iVar11;
    } while (count != uVar14);
    return local_50;
  }
  return 0;
}

Assistant:

static inline idx_t
	SelectGenericLoopSelSwitch(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                           const SelectionVector *__restrict lsel, const SelectionVector *__restrict rsel,
	                           const SelectionVector *__restrict result_sel, idx_t count, ValidityMask &lvalidity,
	                           ValidityMask &rvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		if (true_sel && false_sel) {
			return SelectGenericLoop<LEFT_TYPE, RIGHT_TYPE, OP, NO_NULL, true, true>(
			    ldata, rdata, lsel, rsel, result_sel, count, lvalidity, rvalidity, true_sel, false_sel);
		} else if (true_sel) {
			return SelectGenericLoop<LEFT_TYPE, RIGHT_TYPE, OP, NO_NULL, true, false>(
			    ldata, rdata, lsel, rsel, result_sel, count, lvalidity, rvalidity, true_sel, false_sel);
		} else {
			D_ASSERT(false_sel);
			return SelectGenericLoop<LEFT_TYPE, RIGHT_TYPE, OP, NO_NULL, false, true>(
			    ldata, rdata, lsel, rsel, result_sel, count, lvalidity, rvalidity, true_sel, false_sel);
		}
	}